

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsUtils.cpp
# Opt level: O1

bool intUserDataNotNull(HighsLogOptions *log_options,HighsInt *user_data,string *name)

{
  if (user_data == (HighsInt *)0x0) {
    highsLogUser(log_options,kError,"User-supplied %s are NULL\n",(name->_M_dataplus)._M_p);
  }
  return user_data == (HighsInt *)0x0;
}

Assistant:

bool intUserDataNotNull(const HighsLogOptions& log_options,
                        const HighsInt* user_data, const std::string name) {
  bool null_data = false;
  if (user_data == NULL) {
    highsLogUser(log_options, HighsLogType::kError,
                 "User-supplied %s are NULL\n", name.c_str());
    null_data = true;
  }
  assert(!null_data);
  return null_data;
}